

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O1

bool __thiscall
Centaurus::CompositeATN<unsigned_char>::verify_decisions
          (CompositeATN<unsigned_char> *this,
          unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
          *network)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  long lVar3;
  bool local_a9;
  _Hash_node_base *local_a8;
  ATNPath local_90;
  ATNPath local_70;
  LookaheadDFA<unsigned_char> local_50;
  
  local_a8 = (network->_M_h)._M_before_begin._M_nxt;
  local_a9 = local_a8 == (_Hash_node_base *)0x0;
  if (!local_a9) {
    do {
      p_Var1 = local_a8[7]._M_nxt;
      if (0 < (int)((ulong)((long)local_a8[8]._M_nxt - (long)p_Var1) >> 3) * 0x286bca1b) {
        lVar2 = 0x10;
        lVar3 = 0;
        do {
          if (1 < (int)((ulong)(*(long *)((long)&p_Var1->_M_nxt + lVar2) -
                               *(long *)((long)&p_Var1[-1]._M_nxt + lVar2)) >> 3) * -0x55555555) {
            ATNPath::ATNPath(&local_90,(Identifier *)(local_a8 + 1),(int)lVar3);
            convert_atn_path(&local_70,this,&local_90);
            LookaheadDFA<unsigned_char>::LookaheadDFA(&local_50,this,&local_70,true);
            local_50.super_NFABase<Centaurus::LDFAState<unsigned_char>_>._vptr_NFABase =
                 (_func_int **)&PTR__NFABase_001c9d88;
            std::
            vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
            ::~vector(&local_50.super_NFABase<Centaurus::LDFAState<unsigned_char>_>.m_states);
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector(&local_70.
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     );
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector(&local_90.
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     );
          }
          lVar3 = lVar3 + 1;
          p_Var1 = local_a8[7]._M_nxt;
          lVar2 = lVar2 + 0x98;
        } while (lVar3 < (int)((ulong)((long)local_a8[8]._M_nxt - (long)p_Var1) >> 3) * 0x286bca1b);
      }
      local_a8 = local_a8->_M_nxt;
      local_a9 = local_a8 == (_Hash_node_base *)0x0;
    } while (!local_a9);
  }
  return local_a9;
}

Assistant:

bool CompositeATN<TCHAR>::verify_decisions(const std::unordered_map<Identifier, ATNMachine<TCHAR> >& network) const
{
    for (const auto& p : network)
    {
        for (int i = 0; i < p.second.get_node_num(); i++)
        {
            int outbound_num = p.second.get_node(i).get_transitions().size();

            if (outbound_num > 1)
            {
                try
                {
                    LookaheadDFA<TCHAR>(*this, convert_atn_path(ATNPath(p.first, i)));
                }
                catch (...)
                {
                    std::wcerr << L"Decision check failed at " << ATNPath(p.first, i) << std::endl;
                    return false;
                }
            }
        }
    }
    return true;
}